

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

uchar * __thiscall CNetChunkHeader::Unpack(CNetChunkHeader *this,uchar *pData)

{
  uchar *pData_local;
  CNetChunkHeader *this_local;
  uchar *local_8;
  
  this->m_Flags = (int)(uint)*pData >> 6;
  this->m_Size = (*pData & 0x3f) << 6 | pData[1] & 0x3f;
  this->m_Sequence = -1;
  if ((this->m_Flags & 1U) == 0) {
    local_8 = pData + 2;
  }
  else {
    this->m_Sequence = (pData[1] & 0xc0) << 2 | (uint)pData[2];
    local_8 = pData + 3;
  }
  return local_8;
}

Assistant:

unsigned char *CNetChunkHeader::Unpack(unsigned char *pData)
{
	m_Flags = (pData[0]>>6)&0x03;
	m_Size = ((pData[0]&0x3F)<<6) | (pData[1]&0x3F);
	m_Sequence = -1;
	if(m_Flags&NET_CHUNKFLAG_VITAL)
	{
		m_Sequence = ((pData[1]&0xC0)<<2) | pData[2];
		return pData + 3;
	}
	return pData + 2;
}